

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

uint32_t __thiscall kratos::Var::width(Var *this)

{
  uint64_t uVar1;
  uint *i;
  pointer puVar2;
  
  if ((this->width_param_ == (Var *)0x0) || (this->type_ == Slice)) {
    uVar1 = (uint64_t)this->var_width_;
  }
  else {
    uVar1 = Simulator::static_evaluate_expr(this->width_param_);
  }
  for (puVar2 = (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    uVar1 = (uint64_t)((uint32_t)uVar1 * *puVar2);
  }
  return (uint32_t)uVar1;
}

Assistant:

uint32_t Var::width() const {
    uint32_t w = (width_param_ && type_ != VarType::Slice)
                     ? Simulator::static_evaluate_expr(width_param_)
                     : var_width_;
    for (auto const &i : size_) w *= i;
    return w;
}